

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.cpp
# Opt level: O0

void __thiscall DataSet::shuffle(DataSet *this)

{
  int iVar1;
  uint row2;
  time_t tVar2;
  Shape SVar3;
  uint local_3c;
  uint i;
  uint local_28;
  uint n_row;
  uint next;
  uint prev;
  DataSet *this_local;
  
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  SVar3 = Matrix<double>::shape(&this->m_matrix);
  local_28 = SVar3.n_row;
  for (local_3c = 0; local_3c < local_28; local_3c = local_3c + 1) {
    iVar1 = rand();
    row2 = (uint)(((double)iVar1 / 2147483647.0) * (double)local_28);
    if ((int)row2 < 1) {
      row2 = -row2;
    }
    Matrix<double>::swap(&this->m_matrix,local_3c,row2);
  }
  return;
}

Assistant:

void DataSet::shuffle(){
    srand(time(0));

    unsigned prev, next;
    unsigned n_row=m_matrix.shape().n_row;
    for(unsigned i=0;i<n_row;++i){
        prev=i;
        next=abs((rand()/(double)RAND_MAX)*n_row);
        m_matrix.swap(prev, next);
    }
}